

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::PrependSlow(CordRepBtree *tree,CordRep *rep)

{
  anon_class_8_1_8992209c rep_00;
  bool bVar1;
  CordRepBtree *left;
  FunctionRef<void_(absl::lts_20250127::cord_internal::CordRep_*,_unsigned_long,_unsigned_long)>
  local_38;
  anon_class_8_1_8992209c local_28;
  anon_class_8_1_8992209c consume;
  CordRep *rep_local;
  CordRepBtree *tree_local;
  
  consume.tree = (CordRepBtree **)rep;
  rep_local = &tree->super_CordRep;
  bVar1 = CordRep::IsBtree(rep);
  rep_00.tree = consume.tree;
  if (bVar1) {
    left = CordRep::btree((CordRep *)consume.tree);
    tree_local = MergeTrees(left,(CordRepBtree *)rep_local);
  }
  else {
    local_28.tree = (CordRepBtree **)&rep_local;
    FunctionRef<void(absl::lts_20250127::cord_internal::CordRep*,unsigned_long,unsigned_long)>::
    FunctionRef<absl::lts_20250127::cord_internal::CordRepBtree::PrependSlow(absl::lts_20250127::cord_internal::CordRepBtree*,absl::lts_20250127::cord_internal::CordRep*)::__0,void>
              ((FunctionRef<void(absl::lts_20250127::cord_internal::CordRep*,unsigned_long,unsigned_long)>
                *)&local_38,&local_28);
    ReverseConsume((CordRep *)rep_00.tree,local_38);
    tree_local = (CordRepBtree *)rep_local;
  }
  return tree_local;
}

Assistant:

CordRepBtree* CordRepBtree::PrependSlow(CordRepBtree* tree, CordRep* rep) {
  if (ABSL_PREDICT_TRUE(rep->IsBtree())) {
    return MergeTrees(rep->btree(), tree);
  }
  auto consume = [&tree](CordRep* r, size_t offset, size_t length) {
    r = MakeSubstring(r, offset, length);
    tree = CordRepBtree::AddCordRep<kFront>(tree, r);
  };
  ReverseConsume(rep, consume);
  return tree;
}